

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O3

void nni_epoll_thr(void *arg)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  void *item;
  int *piVar4;
  bool bVar5;
  long *plVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 local_358 [8];
  epoll_event events [64];
  uint64_t clear;
  
LAB_0011c91f:
  do {
    do {
      while( true ) {
        uVar3 = epoll_wait(*(int *)((long)arg + 0x60),(epoll_event *)local_358,0x40,-1);
        if (-1 < (int)uVar3) break;
        piVar4 = __errno_location();
        if (*piVar4 == 9) {
          return;
        }
      }
    } while (uVar3 == 0);
    uVar7 = 0;
    bVar5 = false;
    do {
      plVar6 = (long *)((long)&events[uVar7 - 1].data.ptr + 4);
      while( true ) {
        uVar7 = uVar7 + 1;
        lVar2 = *plVar6;
        if ((*(uint *)((long)plVar6 + -4) & 1) != 0 && lVar2 == 0) break;
        uVar8 = *(uint *)((long)plVar6 + -4) & 0x1d;
        nni_atomic_and((nni_atomic_int *)(lVar2 + 0x30),~uVar8);
        (**(code **)(lVar2 + 0x20))(*(undefined8 *)(lVar2 + 0x28),uVar8);
        plVar6 = (long *)((long)plVar6 + 0xc);
        if (uVar7 == uVar3) {
          if (bVar5) goto LAB_0011c9e6;
          goto LAB_0011c91f;
        }
      }
      read(*(int *)((long)arg + 100),&events[0x3f].data,8);
      bVar5 = true;
    } while (uVar7 != uVar3);
LAB_0011c9e6:
    nni_mtx_lock((nni_mtx *)arg);
    while (item = nni_list_first((nni_list *)((long)arg + 0x108)), item != (void *)0x0) {
      nni_list_remove((nni_list *)((long)arg + 0x108),item);
    }
    nni_cv_wake((nni_cv *)((long)arg + 0x28));
    cVar1 = *(char *)((long)arg + 0x68);
    nni_mtx_unlock((nni_mtx *)arg);
    if (cVar1 == '\x01') {
      return;
    }
  } while( true );
}

Assistant:

static void
nni_epoll_thr(void *arg)
{
	nni_posix_pollq   *pq = arg;
	struct epoll_event events[NNI_MAX_EPOLL_EVENTS];

	for (;;) {
		int  n;
		bool reap = false;

		n = epoll_wait(pq->epfd, events, NNI_MAX_EPOLL_EVENTS, -1);
		if ((n < 0) && (errno == EBADF)) {
			// Epoll fd closed, bail.
			return;
		}

		// dispatch events
		for (int i = 0; i < n; ++i) {
			const struct epoll_event *ev;

			ev = &events[i];
			// If the waker pipe was signaled, read from it.
			if ((ev->data.ptr == NULL) &&
			    (ev->events & (unsigned) POLLIN)) {
				uint64_t clear;
				(void) read(pq->evfd, &clear, sizeof(clear));
				reap = true;
			} else {
				nni_posix_pfd *pfd = ev->data.ptr;
				unsigned       mask;

				mask = ev->events &
				    ((unsigned) (EPOLLIN | EPOLLOUT |
				        EPOLLERR | EPOLLHUP));

				nni_atomic_and(&pfd->events, (int) ~mask);

				// Execute the callback with lock released
				pfd->cb(pfd->arg, mask);
			}
		}

		if (reap) {
			nni_mtx_lock(&pq->mtx);
			nni_posix_pollq_reap(pq);
			if (pq->close) {
				nni_mtx_unlock(&pq->mtx);
				return;
			}
			nni_mtx_unlock(&pq->mtx);
		}
	}
}